

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O3

void __thiscall diy::Master::unload(Master *this,vector<int,_std::allocator<int>_> *loaded)

{
  int i;
  bool bVar1;
  pointer piVar2;
  ulong uVar3;
  pointer piVar4;
  ulong uVar5;
  
  piVar2 = (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 != piVar2) {
    uVar3 = 0;
    uVar5 = 1;
    do {
      i = piVar2[uVar3];
      Collection::unload(&this->blocks_,i);
      unload_incoming(this,(this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[i]);
      unload_outgoing(this,(this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[i]);
      piVar2 = (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar1 = uVar5 < (ulong)((long)piVar4 - (long)piVar2 >> 2);
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  if (piVar4 != piVar2) {
    (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  return;
}

Assistant:

void          unload(std::vector<int>& loaded)    { for(unsigned i = 0; i < loaded.size(); ++i) unload(loaded[i]); loaded.clear(); }